

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall Diligent::GLContextState::EnableDepthWrites(GLContextState *this,bool bEnable)

{
  bool bVar1;
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  GLenum err;
  bool bEnable_local;
  GLContextState *this_local;
  
  msg.field_2._M_local_buf[0xf] = bEnable;
  bVar1 = EnableStateHelper::operator!=(&(this->m_DSState).m_DepthWritesEnableState,bEnable);
  if (bVar1) {
    glDepthMask();
    msg.field_2._8_4_ = glGetError();
    if (msg.field_2._8_4_ != 0) {
      LogError<false,char[38],char[17],unsigned_int>
                (false,"EnableDepthWrites",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x1eb,(char (*) [38])"Failed to enable/disable depth writes",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_38,(char (*) [6])0xe8e72e);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"EnableDepthWrites",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x1eb);
      std::__cxx11::string::~string((string *)local_38);
    }
    EnableStateHelper::operator=
              (&(this->m_DSState).m_DepthWritesEnableState,(bool)(msg.field_2._M_local_buf[0xf] & 1)
              );
  }
  return;
}

Assistant:

void GLContextState::EnableDepthWrites(bool bEnable)
{
    if (m_DSState.m_DepthWritesEnableState != bEnable)
    {
        // If mask is non-zero, the depth buffer is enabled for writing; otherwise, it is disabled.
        glDepthMask(bEnable ? 1 : 0);
        DEV_CHECK_GL_ERROR("Failed to enable/disable depth writes");
        m_DSState.m_DepthWritesEnableState = bEnable;
    }
}